

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  ulong *puVar1;
  uint uVar2;
  RecGroupStore *pRVar3;
  HeapType HVar4;
  Field *pFVar5;
  undefined8 *puVar6;
  _Hash_node_base *p_Var7;
  undefined8 uVar8;
  bool bVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  undefined8 *puVar14;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var15;
  undefined8 *puVar16;
  ulong uVar17;
  size_type __n;
  long lVar18;
  undefined8 *puVar19;
  _Hash_node_base *p_Var20;
  long lVar21;
  pointer __ptr_1;
  const_iterator __begin2;
  ulong uVar22;
  Field *pFVar23;
  Field *b;
  const_iterator __end2;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 local_58 [8];
  __buckets_alloc_type __alloc;
  RecGroupStore *local_38;
  
  lVar18 = 1;
  uVar22 = 1;
  if (((ulong)this & 1) == 0) {
    uVar22 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  if (((ulong)this & 1) == 0) {
    lVar18 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  local_58 = (undefined1  [8])this;
  if (lVar18 != 0) {
    lVar21 = 0;
    do {
      uVar17 = (ulong)this & 0xfffffffffffffffe;
      if (((ulong)this & 1) == 0) {
        uVar17 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar21 * 8);
      }
      if (uVar17 < 0xe) {
        uVar10 = uVar17 + 0x9e3779b97f4a8c15;
      }
      else {
        if (*(char *)(uVar17 + 1) == '\0') {
          __assert_fail("info.isFinalized",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0x84b,
                        "size_t wasm::(anonymous namespace)::RecGroupHasher::hash(const HeapTypeInfo &) const"
                       );
        }
        HVar4.id = *(uintptr_t *)(uVar17 + 8);
        uVar10 = (ulong)(HVar4.id != 0);
        if (HVar4.id != 0) {
          sVar11 = RecGroupHasher::hash((RecGroupHasher *)local_58,HVar4);
          uVar10 = uVar10 ^ sVar11 + 0x9e3779b97f4a8c15;
        }
        uVar2 = *(uint *)(uVar17 + 0x20);
        switch((ulong)uVar2) {
        case 0:
          handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x853);
        case 1:
          sVar11 = RecGroupHasher::hash
                             ((RecGroupHasher *)local_58,(Type)*(uintptr_t *)(uVar17 + 0x28));
          sVar12 = RecGroupHasher::hash
                             ((RecGroupHasher *)local_58,(Type)*(uintptr_t *)(uVar17 + 0x30));
          uVar13 = (sVar11 >> 4) + sVar12 + sVar11 * 0x1000 + -0x61c8864680b583eb ^ sVar11;
          break;
        case 2:
          pFVar23 = *(Field **)(uVar17 + 0x28);
          pFVar5 = *(Field **)(uVar17 + 0x30);
          uVar13 = (long)pFVar5 - (long)pFVar23 >> 4;
          for (; pFVar5 != pFVar23; pFVar23 = pFVar23 + 1) {
            sVar11 = RecGroupHasher::hash((RecGroupHasher *)local_58,pFVar23);
            uVar13 = uVar13 ^ uVar13 * 0x1000 + -0x61c8864680b583eb + (uVar13 >> 4) + sVar11;
          }
          break;
        case 3:
          uVar13 = RecGroupHasher::hash((RecGroupHasher *)local_58,(Field *)(uVar17 + 0x28));
          break;
        default:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x85e);
        }
        uVar10 = (uVar10 >> 4) + (ulong)uVar2 + uVar10 * 0x1000 + -0x61c8864680b583eb ^ uVar10;
        uVar10 = (uVar10 * 0x1000 + -0x61c8864680b583eb + (uVar10 >> 4) + uVar13 ^ uVar10) +
                 0x9e3779b97f4a7c15;
      }
      uVar22 = uVar22 ^ uVar22 * 0x1000 + -0x61c8864680b583eb + (uVar22 >> 4) +
                        (uVar17 < 0xe ^ uVar10);
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar18);
  }
  uVar17 = uVar22 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  puVar14 = *(undefined8 **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar17 * 8);
  puVar16 = (undefined8 *)0x0;
  if (puVar14 != (undefined8 *)0x0) {
    puVar19 = (undefined8 *)*puVar14;
    do {
      if (puVar19[2] == uVar22) {
        pRVar3 = (RecGroupStore *)puVar19[1];
        puVar16 = puVar14;
        local_58 = (undefined1  [8])this;
        ___alloc = (uintptr_t)pRVar3;
        if (pRVar3 == this) break;
        lVar18 = 1;
        lVar21 = 1;
        if (((ulong)this & 1) == 0) {
          lVar21 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
                   (this->mutex).super___mutex_base._M_mutex.__align >> 3;
        }
        if (((ulong)pRVar3 & 1) == 0) {
          lVar18 = *(long *)((long)&(pRVar3->mutex).super___mutex_base._M_mutex + 8) -
                   (pRVar3->mutex).super___mutex_base._M_mutex.__align >> 3;
        }
        if (lVar21 == lVar18) {
          bVar24 = lVar21 == 0;
          if (!bVar24) {
            bVar24 = false;
            lVar18 = 0;
            do {
              uVar10 = (ulong)this & 0xfffffffffffffffe;
              if (((ulong)this & 1) == 0) {
                uVar10 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar18 * 8);
              }
              uVar13 = (ulong)pRVar3 & 0xfffffffffffffffe;
              if (((ulong)pRVar3 & 1) == 0) {
                uVar13 = *(ulong *)((pRVar3->mutex).super___mutex_base._M_mutex.__align + lVar18 * 8
                                   );
              }
              if (uVar10 != uVar13) {
                if ((uVar10 < 0xe) || (uVar13 < 0xe)) break;
                HVar4.id = *(uintptr_t *)(uVar10 + 8);
                if (((HVar4.id != 0) == (*(uintptr_t *)(uVar13 + 8) == 0)) ||
                   (((HVar4.id != 0 &&
                     (bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,HVar4,
                                                  (HeapType)*(uintptr_t *)(uVar13 + 8)), !bVar9)) ||
                    (*(int *)(uVar10 + 0x20) != *(int *)(uVar13 + 0x20))))) break;
                switch(*(int *)(uVar10 + 0x20)) {
                case 0:
                  handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                     ,0x8d1);
                case 1:
                  bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,
                                              (Type)*(uintptr_t *)(uVar10 + 0x28),
                                              (Type)*(uintptr_t *)(uVar13 + 0x28));
                  if (!bVar9) goto LAB_009cb922;
                  bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,
                                              (Type)*(uintptr_t *)(uVar10 + 0x30),
                                              (Type)*(uintptr_t *)(uVar13 + 0x30));
                  break;
                case 2:
                  pFVar23 = *(Field **)(uVar10 + 0x28);
                  pFVar5 = *(Field **)(uVar10 + 0x30);
                  b = *(Field **)(uVar13 + 0x28);
                  if ((long)pFVar5 - (long)pFVar23 != *(long *)(uVar13 + 0x30) - (long)b)
                  goto LAB_009cb922;
                  bVar9 = pFVar23 == pFVar5;
                  if (!bVar9) {
                    bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,pFVar23,b);
                    while( true ) {
                      if (!bVar9) goto LAB_009cb922;
                      b = b + 1;
                      pFVar23 = pFVar23 + 1;
                      bVar9 = pFVar23 == pFVar5;
                      if (bVar9) break;
                      bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,pFVar23,b);
                    }
                  }
                  break;
                case 3:
                  bVar9 = RecGroupEquator::eq((RecGroupEquator *)local_58,(Field *)(uVar10 + 0x28),
                                              (Field *)(uVar13 + 0x28));
                  break;
                default:
                  handle_unreachable("unexpected kind",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                     ,0x8d9);
                }
                if (bVar9 == false) break;
              }
              lVar18 = lVar18 + 1;
              bVar24 = lVar18 == lVar21;
            } while (!bVar24);
          }
LAB_009cb922:
          if (bVar24) break;
        }
      }
      puVar6 = (undefined8 *)*puVar19;
      if (puVar6 == (undefined8 *)0x0) {
        puVar16 = (undefined8 *)0x0;
        break;
      }
      puVar16 = (undefined8 *)0x0;
      puVar14 = puVar19;
      puVar19 = puVar6;
    } while ((ulong)puVar6[2] % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ ==
             uVar17);
  }
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = (undefined8 *)0x0;
  }
  else {
    puVar16 = (undefined8 *)*puVar16;
  }
  puVar14 = puVar16;
  if (puVar16 == (undefined8 *)0x0) {
    puVar14 = (undefined8 *)operator_new(0x18);
    *puVar14 = 0;
    puVar14[1] = this;
    auVar25 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        (0xdbd5d8,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                         wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
    __n = auVar25._8_8_;
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
        __s = (_Hash_node_base **)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)local_58,__n,(void *)0x0
                        );
        memset(__s,0,__n * 8);
      }
      p_Var20 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
      if (p_Var20 != (_Hash_node_base *)0x0) {
        uVar17 = 0;
        do {
          p_Var7 = p_Var20->_M_nxt;
          uVar10 = (ulong)p_Var20[2]._M_nxt % __n;
          if (__s[uVar10] == (_Hash_node_base *)0x0) {
            p_Var20->_M_nxt =
                 (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
            wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var20;
            __s[uVar10] = (_Hash_node_base *)
                          (wasm::(anonymous_namespace)::globalRecGroupStore + 0x38);
            if (p_Var20->_M_nxt != (_Hash_node_base *)0x0) {
              p_Var15 = (_Hash_node_base *)(__s + uVar17);
              goto LAB_009cba66;
            }
          }
          else {
            p_Var20->_M_nxt = __s[uVar10]->_M_nxt;
            p_Var15 = __s[uVar10];
            uVar10 = uVar17;
LAB_009cba66:
            p_Var15->_M_nxt = p_Var20;
          }
          p_Var20 = p_Var7;
          uVar17 = uVar10;
        } while (p_Var7 != (_Hash_node_base *)0x0);
      }
      if (wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ != 0xdbd5e8) {
        operator_delete((void *)wasm::(anonymous_namespace)::globalRecGroupStore._40_8_,
                        wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ << 3);
      }
      uVar17 = uVar22 % __n;
      wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
      wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
    }
    puVar14[2] = uVar22;
    uVar8 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
    puVar19 = *(undefined8 **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar17 * 8)
    ;
    if (puVar19 == (undefined8 *)0x0) {
      *puVar14 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      puVar19 = puVar14;
      if (wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ != 0) {
        puVar1 = (ulong *)(wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ + 0x10);
        wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar14;
        *(undefined8 **)
         (uVar8 + (*puVar1 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) =
             puVar14;
        puVar19 = (undefined8 *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      }
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar19;
      *(undefined8 *)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar17 * 8) =
           0xdbd5c8;
    }
    else {
      *puVar14 = *puVar19;
      **(undefined8 **)(uVar8 + uVar17 * 8) = puVar14;
    }
    wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
         wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  }
  local_38 = this;
  if (puVar16 != (undefined8 *)0x0) {
    local_38 = (RecGroupStore *)puVar14[1];
  }
  return (RecGroup)(uintptr_t)local_38;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }